

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateImplementation
          (ServiceGenerator *this,Printer *printer)

{
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  ServiceGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&this->vars_);
  Formatter::operator()
            ((Formatter *)local_50,
             "$classname$::~$classname$() {}\n\nconst ::$proto_ns$::ServiceDescriptor* $classname$::descriptor() {\n  ::$proto_ns$::internal::AssignDescriptors(&$desc_table$);\n  return $file_level_service_descriptors$[$1$];\n}\n\nconst ::$proto_ns$::ServiceDescriptor* $classname$::GetDescriptor() {\n  return descriptor();\n}\n\n"
             ,&this->index_in_metadata_);
  GenerateNotImplementedMethods
            (this,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  GenerateCallMethod(this,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  GenerateGetPrototype
            (this,REQUEST,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  GenerateGetPrototype
            (this,RESPONSE,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  Formatter::operator()<>
            ((Formatter *)local_50,
             "$classname$_Stub::$classname$_Stub(::$proto_ns$::RpcChannel* channel)\n  : channel_(channel), owns_channel_(false) {}\n$classname$_Stub::$classname$_Stub(\n    ::$proto_ns$::RpcChannel* channel,\n    ::$proto_ns$::Service::ChannelOwnership ownership)\n  : channel_(channel),\n    owns_channel_(ownership == ::$proto_ns$::Service::STUB_OWNS_CHANNEL) {}\n$classname$_Stub::~$classname$_Stub() {\n  if (owns_channel_) delete channel_;\n}\n\n"
            );
  GenerateStubMethods(this,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void ServiceGenerator::GenerateImplementation(io::Printer* printer) {
  Formatter format(printer, vars_);
  format(
      "$classname$::~$classname$() {}\n"
      "\n"
      "const ::$proto_ns$::ServiceDescriptor* $classname$::descriptor() {\n"
      "  "
      "::$proto_ns$::internal::AssignDescriptors(&$desc_table$);\n"
      "  return $file_level_service_descriptors$[$1$];\n"
      "}\n"
      "\n"
      "const ::$proto_ns$::ServiceDescriptor* $classname$::GetDescriptor() {\n"
      "  return descriptor();\n"
      "}\n"
      "\n",
      index_in_metadata_);

  // Generate methods of the interface.
  GenerateNotImplementedMethods(printer);
  GenerateCallMethod(printer);
  GenerateGetPrototype(REQUEST, printer);
  GenerateGetPrototype(RESPONSE, printer);

  // Generate stub implementation.
  format(
      "$classname$_Stub::$classname$_Stub(::$proto_ns$::RpcChannel* channel)\n"
      "  : channel_(channel), owns_channel_(false) {}\n"
      "$classname$_Stub::$classname$_Stub(\n"
      "    ::$proto_ns$::RpcChannel* channel,\n"
      "    ::$proto_ns$::Service::ChannelOwnership ownership)\n"
      "  : channel_(channel),\n"
      "    owns_channel_(ownership == "
      "::$proto_ns$::Service::STUB_OWNS_CHANNEL) "
      "{}\n"
      "$classname$_Stub::~$classname$_Stub() {\n"
      "  if (owns_channel_) delete channel_;\n"
      "}\n"
      "\n");

  GenerateStubMethods(printer);
}